

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryCamerasLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryCamerasLoader::begin__camera
          (LibraryCamerasLoader *this,camera__AttributeData *attributeData)

{
  int iVar1;
  Camera *pCVar2;
  undefined4 extraout_var;
  allocator<char> local_39;
  UniqueId local_38;
  
  pCVar2 = (Camera *)operator_new(0x130);
  IFilePartLoader::createUniqueIdFromId(&local_38,(IFilePartLoader *)this,attributeData->id,CAMERA);
  COLLADAFW::Camera::Camera(pCVar2,&local_38);
  this->mCurrentCamera = pCVar2;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id == (char *)0x0) goto LAB_007b6386;
    pCVar2 = this->mCurrentCamera;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->id,&local_39);
    std::__cxx11::string::_M_assign((string *)&pCVar2->mName);
  }
  else {
    pCVar2 = this->mCurrentCamera;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pCVar2->mName);
  }
  if (local_38._0_8_ != (long)&local_38 + 0x10U) {
    operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
  }
LAB_007b6386:
  if (attributeData->id != (char *)0x0) {
    pCVar2 = this->mCurrentCamera;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->id,&local_39);
    std::__cxx11::string::_M_assign((string *)&pCVar2->mOriginalId);
    if (local_38._0_8_ != (long)&local_38 + 0x10U) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
  }
  iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[2])(this);
  DocumentProcessor::addToSidTree
            ((DocumentProcessor *)CONCAT44(extraout_var,iVar1),attributeData->id,(char *)0x0);
  return true;
}

Assistant:

bool LibraryCamerasLoader::begin__camera( const camera__AttributeData& attributeData )
	{
		mCurrentCamera = FW_NEW COLLADAFW::Camera( createUniqueIdFromId( attributeData.id, COLLADAFW::Camera::ID()) );

		if ( attributeData.name )
			mCurrentCamera->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentCamera->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentCamera->setOriginalId ( (const char*)attributeData.id );

		getFileLoader()->addToSidTree( attributeData.id, 0);
		return true;
	}